

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O3

void message_client_connection_onConnect(void *arg,char *addr,uint16_t port)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined6 in_register_00000012;
  
  if ((arg != (void *)0x0) && (*(long *)((long)arg + 8) != 0)) {
    uVar1 = adt_bytearray_data(*(long *)((long)arg + 8),addr,CONCAT62(in_register_00000012,port));
    uVar2 = adt_bytearray_length(*(undefined8 *)((long)arg + 8));
    msocket_send(*arg,uVar1,uVar2);
    sem_post((sem_t *)((long)arg + 0x10));
    return;
  }
  return;
}

Assistant:

static void message_client_connection_onConnect(void *arg, const char *addr, uint16_t port)
{
   message_client_connection_t *self = (message_client_connection_t*) arg;
   (void)port;
   (void)addr;
   if (self != 0 )
   {
      if (self->pendingMessage != 0)
      {
         const char *data = (const char*) adt_bytearray_data(self->pendingMessage);
         uint32_t size = adt_bytearray_length(self->pendingMessage);
#if APX_DEBUG_ENABLE
         printf("[APX_CONTROL] Message transmitted\n");
#endif
         msocket_send(self->msocket, data, size);
         SEMAPHORE_POST(self->messageTransmitted);

      }
   }
}